

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

void __thiscall Parser::error(Parser *this,char *message)

{
  ostream *poVar1;
  ParseException *this_00;
  char *message_00;
  Token local_220;
  Token local_1e8;
  stringstream local_1a0 [8];
  stringstream msg;
  ostream local_190 [376];
  char *local_18;
  char *message_local;
  Parser *this_local;
  
  local_18 = message;
  message_local = (char *)this;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Parse error on line ");
  token(&local_1e8,this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_1e8.line);
  poVar1 = std::operator<<(poVar1," column ");
  token(&local_220,this);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_220.col);
  poVar1 = std::operator<<(poVar1,":\n\t");
  std::operator<<(poVar1,local_18);
  Token::~Token(&local_220);
  Token::~Token(&local_1e8);
  this_00 = (ParseException *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringstream::str();
  message_00 = (char *)std::__cxx11::string::c_str();
  ParseException::ParseException(this_00,message_00);
  __cxa_throw(this_00,&ParseException::typeinfo,ParseException::~ParseException);
}

Assistant:

void Parser::error(const char *message) {
    std::stringstream msg;
    msg << "Parse error on line " << token().line <<  " column " << token().col << ":\n\t" << message;
    throw ParseException(msg.str().c_str());
}